

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void helper_set_macsr_m68k(CPUM68KState_conflict *env,uint32_t val)

{
  uint64_t uVar1;
  undefined1 uVar2;
  int local_2c;
  ulong uStack_28;
  int i;
  uint64_t regval;
  undefined4 local_18;
  uint8_t extlow;
  int8_t exthigh;
  uint32_t acc;
  uint32_t val_local;
  CPUM68KState_conflict *env_local;
  
  if (((env->macsr ^ val) & 0x60) != 0) {
    for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
      uVar1 = env->macc[local_2c];
      uVar2 = (undefined1)(uVar1 >> 0x28);
      if ((env->macsr & 0x20) == 0) {
        local_18 = (undefined4)uVar1;
        regval._6_1_ = (undefined1)(uVar1 >> 0x20);
      }
      else {
        local_18 = (undefined4)(uVar1 >> 8);
        regval._6_1_ = (undefined1)uVar1;
      }
      if ((env->macsr & 0x20) == 0) {
        if ((env->macsr & 0x40) == 0) {
          uStack_28 = (ulong)CONCAT15(uVar2,CONCAT14(regval._6_1_,local_18));
        }
        else {
          uStack_28 = (ulong)CONCAT15(uVar2,CONCAT14(regval._6_1_,local_18));
        }
      }
      else {
        uStack_28 = (ulong)CONCAT15(uVar2,CONCAT41(local_18,regval._6_1_));
      }
      env->macc[local_2c] = uStack_28;
    }
  }
  env->macsr = val;
  return;
}

Assistant:

void HELPER(set_macsr)(CPUM68KState *env, uint32_t val)
{
    uint32_t acc;
    int8_t exthigh;
    uint8_t extlow;
    uint64_t regval;
    int i;
    if ((env->macsr ^ val) & (MACSR_FI | MACSR_SU)) {
        for (i = 0; i < 4; i++) {
            regval = env->macc[i];
            exthigh = regval >> 40;
            if (env->macsr & MACSR_FI) {
                acc = regval >> 8;
                extlow = regval;
            } else {
                acc = regval;
                extlow = regval >> 32;
            }
            if (env->macsr & MACSR_FI) {
                regval = (((uint64_t)acc) << 8) | extlow;
                regval |= ((int64_t)exthigh) << 40;
            } else if (env->macsr & MACSR_SU) {
                regval = acc | (((int64_t)extlow) << 32);
                regval |= ((int64_t)exthigh) << 40;
            } else {
                regval = acc | (((uint64_t)extlow) << 32);
                regval |= ((uint64_t)(uint8_t)exthigh) << 40;
            }
            env->macc[i] = regval;
        }
    }
    env->macsr = val;
}